

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O3

MPP_RET enc_impl_deinit(EncImpl impl)

{
  code *pcVar1;
  MPP_RET MVar2;
  
  if (impl == (EncImpl)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_deinit");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    pcVar1 = *(code **)(*(long *)((long)impl + 0x18) + 0x20);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(*(undefined8 *)((long)impl + 0x20));
    }
    mpp_osal_free("enc_impl_deinit",*(void **)((long)impl + 0x20));
    mpp_osal_free("enc_impl_deinit",impl);
    MVar2 = MPP_OK;
  }
  return MVar2;
}

Assistant:

MPP_RET enc_impl_deinit(EncImpl impl)
{
    if (NULL == impl) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    EncImplCtx *p = (EncImplCtx *)impl;
    if (p->api->deinit)
        p->api->deinit(p->ctx);

    mpp_free(p->ctx);
    mpp_free(p);
    return MPP_OK;
}